

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O2

void __thiscall
Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix)

{
  long local_30;
  long local_28;
  
  local_28 = *(long *)(matrix + 8);
  local_30 = *(long *)(matrix + 0x10);
  Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)this,&local_28,&local_30);
  PermutationMatrix<-1,_-1,_int>::PermutationMatrix
            ((PermutationMatrix<_1,__1,_int> *)(this + 0x18),*(Index *)(matrix + 8));
  Transpositions<-1,_-1,_int>::Transpositions
            ((Transpositions<_1,__1,_int> *)(this + 0x28),*(Index *)(matrix + 8));
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined2 *)(this + 0x40) = 0;
  compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>(this,matrix);
  return;
}

Assistant:

PartialPivLU<MatrixType>::PartialPivLU(const EigenBase<InputType>& matrix)
  : m_lu(matrix.rows(),matrix.cols()),
    m_p(matrix.rows()),
    m_rowsTranspositions(matrix.rows()),
    m_l1_norm(0),
    m_det_p(0),
    m_isInitialized(false)
{
  compute(matrix.derived());
}